

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O0

void __thiscall box::box(box *this,vec3 *p0,vec3 *p1,shared_ptr<material> *ptr)

{
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<material> local_1e8;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  shared_ptr<yz_rect> local_1c0;
  shared_ptr<hittable> local_1b0;
  shared_ptr<material> local_1a0;
  double local_190;
  double local_188;
  double local_180;
  shared_ptr<yz_rect> local_178;
  shared_ptr<hittable> local_168;
  shared_ptr<material> local_158;
  double local_148;
  double local_140;
  double local_138;
  shared_ptr<xz_rect> local_130;
  shared_ptr<hittable> local_120;
  shared_ptr<material> local_110;
  double local_100;
  double local_f8;
  double local_f0;
  shared_ptr<xz_rect> local_e8;
  shared_ptr<hittable> local_d8;
  shared_ptr<material> local_c8;
  double local_b8;
  double local_b0;
  double local_a8;
  shared_ptr<xy_rect> local_a0;
  shared_ptr<hittable> local_90;
  shared_ptr<material> local_80;
  double local_70;
  double local_68 [3];
  double local_50;
  shared_ptr<xy_rect> local_48;
  shared_ptr<hittable> local_38;
  shared_ptr<material> *local_28;
  shared_ptr<material> *ptr_local;
  vec3 *p1_local;
  vec3 *p0_local;
  box *this_local;
  
  local_28 = ptr;
  ptr_local = (shared_ptr<material> *)p1;
  p1_local = p0;
  p0_local = (vec3 *)this;
  hittable::hittable(&this->super_hittable);
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0015ff88;
  vec3::vec3(&this->box_min);
  vec3::vec3(&this->box_max);
  hittable_list::hittable_list(&this->sides);
  (this->box_min).e[2] = p1_local->e[2];
  dVar1 = p1_local->e[1];
  (this->box_min).e[0] = p1_local->e[0];
  (this->box_min).e[1] = dVar1;
  (this->box_max).e[2] =
       (double)ptr_local[1].super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (ptr_local->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->box_max).e[0] =
       (double)(ptr_local->super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->box_max).e[1] = (double)p_Var2;
  local_50 = vec3::x(p1_local);
  local_68[0] = vec3::x((vec3 *)ptr_local);
  local_70 = vec3::y(p1_local);
  local_80.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vec3::y((vec3 *)ptr_local);
  local_80.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)vec3::z((vec3 *)ptr_local);
  std::make_shared<xy_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_48,&local_50,local_68,&local_70,
             (double *)
             &local_80.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_80);
  std::shared_ptr<hittable>::shared_ptr<xy_rect,void>(&local_38,&local_48);
  hittable_list::add(&this->sides,&local_38);
  std::shared_ptr<hittable>::~shared_ptr(&local_38);
  std::shared_ptr<xy_rect>::~shared_ptr(&local_48);
  local_a8 = vec3::x(p1_local);
  local_b0 = vec3::x((vec3 *)ptr_local);
  local_b8 = vec3::y(p1_local);
  local_c8.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vec3::y((vec3 *)ptr_local);
  local_c8.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)vec3::z(p1_local);
  std::make_shared<xy_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_a0,&local_a8,&local_b0,&local_b8,
             (double *)
             &local_c8.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_c8);
  std::shared_ptr<hittable>::shared_ptr<xy_rect,void>(&local_90,&local_a0);
  hittable_list::add(&this->sides,&local_90);
  std::shared_ptr<hittable>::~shared_ptr(&local_90);
  std::shared_ptr<xy_rect>::~shared_ptr(&local_a0);
  local_f0 = vec3::x(p1_local);
  local_f8 = vec3::x((vec3 *)ptr_local);
  local_100 = vec3::z(p1_local);
  local_110.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vec3::z((vec3 *)ptr_local);
  local_110.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)vec3::y((vec3 *)ptr_local);
  std::make_shared<xz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_e8,&local_f0,&local_f8,&local_100,
             (double *)
             &local_110.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_110);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_d8,&local_e8);
  hittable_list::add(&this->sides,&local_d8);
  std::shared_ptr<hittable>::~shared_ptr(&local_d8);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_e8);
  local_138 = vec3::x(p1_local);
  local_140 = vec3::x((vec3 *)ptr_local);
  local_148 = vec3::z(p1_local);
  local_158.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vec3::z((vec3 *)ptr_local);
  local_158.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)vec3::y(p1_local);
  std::make_shared<xz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_130,&local_138,&local_140,&local_148,
             (double *)
             &local_158.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_158);
  std::shared_ptr<hittable>::shared_ptr<xz_rect,void>(&local_120,&local_130);
  hittable_list::add(&this->sides,&local_120);
  std::shared_ptr<hittable>::~shared_ptr(&local_120);
  std::shared_ptr<xz_rect>::~shared_ptr(&local_130);
  local_180 = vec3::y(p1_local);
  local_188 = vec3::y((vec3 *)ptr_local);
  local_190 = vec3::z(p1_local);
  local_1a0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vec3::z((vec3 *)ptr_local);
  local_1a0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)vec3::x((vec3 *)ptr_local);
  std::make_shared<yz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_178,&local_180,&local_188,&local_190,
             (double *)
             &local_1a0.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_1a0);
  std::shared_ptr<hittable>::shared_ptr<yz_rect,void>(&local_168,&local_178);
  hittable_list::add(&this->sides,&local_168);
  std::shared_ptr<hittable>::~shared_ptr(&local_168);
  std::shared_ptr<yz_rect>::~shared_ptr(&local_178);
  local_1c8 = vec3::y(p1_local);
  local_1d0 = vec3::y((vec3 *)ptr_local);
  local_1d8 = vec3::z(p1_local);
  local_1e8.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vec3::z((vec3 *)ptr_local);
  local_1e8.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)vec3::x(p1_local);
  std::make_shared<yz_rect,double,double,double,double,double,std::shared_ptr<material>&>
            ((double *)&local_1c0,&local_1c8,&local_1d0,&local_1d8,
             (double *)
             &local_1e8.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_1e8);
  std::shared_ptr<hittable>::shared_ptr<yz_rect,void>(&local_1b0,&local_1c0);
  hittable_list::add(&this->sides,&local_1b0);
  std::shared_ptr<hittable>::~shared_ptr(&local_1b0);
  std::shared_ptr<yz_rect>::~shared_ptr(&local_1c0);
  return;
}

Assistant:

box::box(const vec3& p0, const vec3& p1, shared_ptr<material> ptr) {
    box_min = p0;
    box_max = p1;

    sides.add(make_shared<xy_rect>(p0.x(), p1.x(), p0.y(), p1.y(), p1.z(), ptr));
    sides.add(make_shared<xy_rect>(p0.x(), p1.x(), p0.y(), p1.y(), p0.z(), ptr));

    sides.add(make_shared<xz_rect>(p0.x(), p1.x(), p0.z(), p1.z(), p1.y(), ptr));
    sides.add(make_shared<xz_rect>(p0.x(), p1.x(), p0.z(), p1.z(), p0.y(), ptr));

    sides.add(make_shared<yz_rect>(p0.y(), p1.y(), p0.z(), p1.z(), p1.x(), ptr));
    sides.add(make_shared<yz_rect>(p0.y(), p1.y(), p0.z(), p1.z(), p0.x(), ptr));
}